

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

plutovg_path_command_t
plutovg_path_iterator_next(plutovg_path_iterator_t *it,plutovg_point_t *points)

{
  plutovg_path_element_t *ppVar1;
  plutovg_path_command_t pVar2;
  long lVar3;
  
  ppVar1 = it->elements + it->index;
  pVar2 = (ppVar1->header).command;
  lVar3 = 8;
  if ((PLUTOVG_PATH_COMMAND_LINE_TO < pVar2) && (pVar2 != PLUTOVG_PATH_COMMAND_CLOSE)) {
    if (pVar2 != PLUTOVG_PATH_COMMAND_CUBIC_TO) goto LAB_00107f90;
    *points = (plutovg_point_t)ppVar1[1];
    *(plutovg_path_element_t *)(points + 1) = ppVar1[2];
    points = points + 2;
    lVar3 = 0x18;
  }
  *points = *(plutovg_point_t *)((long)ppVar1 + lVar3);
LAB_00107f90:
  it->index = it->index + *(int *)((long)ppVar1 + 4);
  return (ppVar1->header).command;
}

Assistant:

plutovg_path_command_t plutovg_path_iterator_next(plutovg_path_iterator_t* it, plutovg_point_t points[3])
{
    const plutovg_path_element_t* elements = it->elements + it->index;
    switch(elements[0].header.command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
    case PLUTOVG_PATH_COMMAND_LINE_TO:
    case PLUTOVG_PATH_COMMAND_CLOSE:
        points[0] = elements[1].point;
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        points[0] = elements[1].point;
        points[1] = elements[2].point;
        points[2] = elements[3].point;
        break;
    }

    it->index += elements[0].header.length;
    return elements[0].header.command;
}